

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej pj;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_scalar sStack_2b8;
  secp256k1_scalar local_298;
  secp256k1_gej local_278;
  secp256k1_gej local_1f8;
  secp256k1_gej local_178;
  secp256k1_gej local_f8;
  secp256k1_ge local_78;
  
  testutil_random_scalar_order_test(&local_298);
  secp256k1_scalar_add(&sStack_2b8,&local_298,target);
  secp256k1_scalar_negate(&sStack_2b8,&sStack_2b8);
  if (mode == 0) {
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_f8,&local_298);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_178,&sStack_2b8);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_1f8,target);
  }
  else {
    testutil_random_ge_test(&local_78);
    local_278.infinity = local_78.infinity;
    local_278.x.n[0] = local_78.x.n[0];
    local_278.x.n[1] = local_78.x.n[1];
    local_278.x.n[2] = local_78.x.n[2];
    local_278.x.n[3] = local_78.x.n[3];
    local_278.x.n[4] = local_78.x.n[4];
    local_278.y.n[0] = local_78.y.n[0];
    local_278.y.n[1] = local_78.y.n[1];
    local_278.y.n[2] = local_78.y.n[2];
    local_278.y.n[3] = local_78.y.n[3];
    local_278.y.n[4] = local_78.y.n[4];
    local_278.z.n[0] = 1;
    local_278.z.n[1] = 0;
    local_278.z.n[2] = 0;
    local_278.z.n[3] = 0;
    local_278.z.n[4] = 0;
    if (mode == 1) {
      secp256k1_ecmult(&local_f8,&local_278,&local_298,&secp256k1_scalar_zero);
      secp256k1_ecmult(&local_178,&local_278,&sStack_2b8,&secp256k1_scalar_zero);
      secp256k1_ecmult(&local_1f8,&local_278,target,&secp256k1_scalar_zero);
    }
    else {
      secp256k1_ecmult_const(&local_f8,&local_78,&local_298);
      secp256k1_ecmult_const(&local_178,&local_78,&sStack_2b8);
      secp256k1_ecmult_const(&local_1f8,&local_78,target);
    }
  }
  secp256k1_gej_add_var(&local_1f8,&local_1f8,&local_f8,(secp256k1_fe *)0x0);
  secp256k1_gej_add_var(&local_1f8,&local_1f8,&local_178,(secp256k1_fe *)0x0);
  if (local_1f8.infinity != 0) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1116,"test condition failed: secp256k1_gej_is_infinity(&ptj)");
  abort();
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}